

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_begin_window_ex(mu_Context *ctx,char *title,mu_Rect rect,int opt)

{
  mu_Rect *pmVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int extraout_EAX;
  size_t sVar15;
  mu_Container *cnt;
  long lVar16;
  mu_Command *pmVar17;
  long lVar18;
  int iVar19;
  mu_Vec2 mVar20;
  ulong extraout_RDX;
  int iVar21;
  int iVar22;
  uint id;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  mu_Container *pmVar26;
  mu_Vec2 mVar27;
  mu_Context *ctx_00;
  int iVar28;
  ulong uVar29;
  mu_Id mVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  mu_Rect mVar36;
  mu_Rect rect_00;
  mu_Rect mVar37;
  mu_Rect mVar38;
  mu_Rect rect_01;
  mu_Rect mVar39;
  mu_Rect mVar40;
  mu_Rect rect_02;
  mu_Rect body;
  mu_Rect rect_03;
  mu_Rect rect_04;
  mu_Rect rect_05;
  mu_Rect body_00;
  mu_Rect rect_06;
  mu_Rect rect_07;
  mu_Rect rect_08;
  char local_74;
  
  uVar35 = (ulong)(uint)opt;
  sVar15 = strlen(title);
  uVar23 = (ctx->id_stack).idx;
  mVar20.y = 0;
  mVar20.x = uVar23;
  if ((int)uVar23 < 1) {
    pmVar26 = (mu_Container *)0x811c9dc5;
  }
  else {
    mVar20.x = uVar23 - 1;
    mVar20.y = 0;
    pmVar26 = (mu_Container *)(ulong)(ctx->id_stack).items[(long)mVar20];
  }
  if ((int)sVar15 != 0) {
    mVar20.x = 0;
    mVar20.y = 0;
    do {
      pmVar26 = (mu_Container *)
                (ulong)(((uint)(byte)title[(long)mVar20] ^ (uint)pmVar26) * 0x1000193);
      mVar20 = (mu_Vec2)((long)mVar20 + 1);
    } while ((int)sVar15 != mVar20.x);
  }
  mVar30 = (mu_Id)pmVar26;
  ctx->last_id = mVar30;
  ctx_00 = ctx;
  cnt = get_container(ctx,mVar30,opt);
  if ((cnt == (mu_Container *)0x0) || (cnt->open == 0)) {
    return 0;
  }
  lVar16 = (long)(ctx->id_stack).idx;
  if (lVar16 < 0x20) {
    (ctx->id_stack).items[lVar16] = mVar30;
    (ctx->id_stack).idx = (ctx->id_stack).idx + 1;
    if ((((uint)opt >> 0xd & 1) != 0) || ((cnt->rect).w == 0)) {
      (cnt->rect).x = (int)rect._0_8_;
      (cnt->rect).y = (int)((ulong)rect._0_8_ >> 0x20);
      (cnt->rect).w = (int)rect._8_8_;
      (cnt->rect).h = (int)((ulong)rect._8_8_ >> 0x20);
    }
    iVar33 = (ctx->container_stack).idx;
    if (0x1f < (long)iVar33) goto LAB_00149e02;
    (ctx->container_stack).items[iVar33] = cnt;
    (ctx->container_stack).idx = iVar33 + 1;
    iVar33 = (ctx->root_list).idx;
    if ((long)iVar33 < 0x20) {
      (ctx->root_list).items[iVar33] = cnt;
      (ctx->root_list).idx = iVar33 + 1;
      pmVar26 = (mu_Container *)0x1;
      ctx_00 = ctx;
      pmVar17 = mu_push_command(ctx,1,0x10);
      (pmVar17->jump).dst = (void *)0x0;
      cnt->head = pmVar17;
      uVar10 = (cnt->rect).x;
      uVar12 = (cnt->rect).y;
      mVar27 = ctx->mouse_pos;
      mVar20 = mVar27;
      if ((int)uVar10 <= mVar27.x) {
        uVar11 = (cnt->rect).w;
        uVar13 = (cnt->rect).h;
        pmVar26 = (mu_Container *)(ulong)(uint)(uVar11 + uVar10);
        if (mVar27.x < (int)(uVar11 + uVar10)) {
          mVar20 = (mu_Vec2)((ulong)mVar27 >> 0x20);
          if ((((int)uVar12 <= mVar27.y) && (mVar27.y < (int)(uVar13 + uVar12))) &&
             ((ctx->next_hover_root == (mu_Container *)0x0 ||
              (mVar20.y = 0, mVar20.x = cnt->zindex, ctx->next_hover_root->zindex < cnt->zindex))))
          {
            ctx->next_hover_root = cnt;
          }
        }
      }
      lVar16 = (long)(ctx->clip_stack).idx;
      if (lVar16 < 0x20) {
        (ctx->clip_stack).items[lVar16] = unclipped_rect;
        (ctx->clip_stack).idx = (ctx->clip_stack).idx + 1;
        pmVar1 = &cnt->rect;
        uVar35._0_4_ = pmVar1->x;
        uVar35._4_4_ = pmVar1->y;
        uVar25._0_4_ = (cnt->rect).w;
        uVar25._4_4_ = (cnt->rect).h;
        uVar24 = uVar35 >> 0x20;
        if ((opt & 8U) == 0) {
          (*ctx->draw_frame)(ctx,*pmVar1,2);
        }
        local_74 = (char)opt;
        uVar32 = uVar25;
        if (-1 < local_74) {
          uVar23 = ctx->style->title_height;
          lVar16 = ((ulong)uVar23 << 0x20) + (uVar25 & 0xffffffff);
          mVar36._8_8_ = lVar16;
          mVar36.x = (undefined4)uVar35;
          mVar36.y = uVar35._4_4_;
          (*ctx->draw_frame)(ctx,mVar36,3);
          iVar33 = (ctx->id_stack).idx;
          if (iVar33 < 1) {
            id = 0x811c9dc5;
          }
          else {
            id = (ctx->id_stack).items[iVar33 - 1];
          }
          lVar18 = 0;
          do {
            id = ((byte)"!title"[lVar18] ^ id) * 0x1000193;
            lVar18 = lVar18 + 1;
          } while ((int)lVar18 != 6);
          ctx->last_id = id;
          rect_03._8_8_ = lVar16;
          rect_03.x = (undefined4)uVar35;
          rect_03.y = uVar35._4_4_;
          mu_update_control(ctx,id,rect_03,opt);
          rect_04._8_8_ = lVar16;
          rect_04.x = (undefined4)uVar35;
          rect_04.y = uVar35._4_4_;
          mu_draw_control_text(ctx,title,rect_04,4,opt);
          if ((id == ctx->focus) && (ctx->mouse_down == 1)) {
            mVar20 = ctx->mouse_delta;
            uVar3 = (cnt->rect).x;
            uVar7 = (cnt->rect).y;
            (cnt->rect).x = uVar3 + mVar20.x;
            (cnt->rect).y = uVar7 + mVar20.y;
          }
          uVar24 = (ulong)(uVar23 + uVar35._4_4_);
          uVar32 = ((ulong)(uVar25._4_4_ - uVar23) << 0x20) + (uVar25 & 0xffffffff);
          if ((opt & 0x40U) == 0) {
            iVar33 = (ctx->id_stack).idx;
            if (iVar33 < 1) {
              mVar30 = 0x811c9dc5;
            }
            else {
              mVar30 = (ctx->id_stack).items[iVar33 - 1];
            }
            lVar16 = 0;
            do {
              mVar30 = ((byte)"!close"[lVar16] ^ mVar30) * 0x1000193;
              lVar16 = lVar16 + 1;
            } while ((int)lVar16 != 6);
            ctx->last_id = mVar30;
            uVar29 = (ulong)(((undefined4)uVar25 + (undefined4)uVar35) - uVar23) |
                     uVar35 & 0xffffffff00000000;
            mu_draw_icon(ctx,1,(mu_Rect)CONCAT88(CONCAT44(uVar23,uVar23),
                                                 CONCAT44((int)(uVar29 >> 0x20),(int)uVar29)),
                         ctx->style->colors[4]);
            rect_05.w = uVar23;
            rect_05.h = uVar23;
            rect_05.x = (int)uVar29;
            rect_05.y = (int)(uVar29 >> 0x20);
            mu_update_control(ctx,mVar30,rect_05,opt);
            if ((ctx->mouse_pressed == 1) && (mVar30 == ctx->focus)) {
              cnt->open = 0;
            }
          }
        }
        body_00.w = (int)uVar32;
        body_00.h = (int)(uVar32 >> 0x20);
        body_00._0_8_ = (uVar24 << 0x20) + (uVar35 & 0xffffffff);
        push_container_body(ctx,cnt,body_00,opt);
        if ((opt & 0x10U) == 0) {
          iVar33 = ctx->style->title_height;
          iVar34 = (ctx->id_stack).idx;
          if (iVar34 < 1) {
            uVar23 = 0x811c9dc5;
          }
          else {
            uVar23 = (ctx->id_stack).items[iVar34 - 1];
          }
          lVar16 = 0;
          do {
            uVar23 = ((byte)"!resize"[lVar16] ^ uVar23) * 0x1000193;
            lVar16 = lVar16 + 1;
          } while ((int)lVar16 != 7);
          ctx->last_id = uVar23;
          rect_06.x = ((undefined4)uVar25 + (undefined4)uVar35) - iVar33;
          rect_06.y = (uVar25._4_4_ + uVar35._4_4_) - iVar33;
          rect_06.h = iVar33;
          rect_06.w = iVar33;
          mu_update_control(ctx,uVar23,rect_06,opt);
          if ((uVar23 == ctx->focus) && (ctx->mouse_down == 1)) {
            uVar4 = (cnt->rect).w;
            uVar8 = (cnt->rect).h;
            iVar33 = (ctx->mouse_delta).x + uVar4;
            iVar34 = (ctx->mouse_delta).y + uVar8;
            uVar35 = CONCAT44(-(uint)(0x40 < iVar34),-(uint)(0x60 < iVar33));
            uVar35 = ~uVar35 & 0x4000000060 | CONCAT44(iVar34,iVar33) & uVar35;
            (cnt->rect).w = (int)uVar35;
            (cnt->rect).h = (int)(uVar35 >> 0x20);
          }
        }
        if (((uint)opt >> 9 & 1) != 0) {
          uVar6 = *(undefined8 *)((long)&ctx->id_stack + (long)(ctx->layout_stack).idx * 0x8c + 4);
          mVar20 = cnt->content_size;
          uVar5 = (cnt->rect).w;
          uVar9 = (cnt->rect).h;
          (cnt->rect).w = uVar5 + (mVar20.x - (int)uVar6);
          (cnt->rect).h = uVar9 + (mVar20.y - (int)((ulong)uVar6 >> 0x20));
        }
        if (((((uint)opt >> 10 & 1) != 0) && (ctx->mouse_pressed != 0)) && (ctx->hover_root != cnt))
        {
          cnt->open = 0;
        }
        mu_push_clip_rect(ctx,cnt->body);
        return 1;
      }
      goto LAB_00149e0c;
    }
  }
  else {
    mu_begin_window_ex_cold_1();
LAB_00149e02:
    mu_begin_window_ex_cold_2();
  }
  mu_begin_window_ex_cold_3();
LAB_00149e0c:
  mu_begin_window_ex_cold_4();
  iVar33 = (int)extraout_RDX;
  iVar34 = (int)(extraout_RDX >> 0x20);
  if ((uVar35 & 0x20) == 0) {
    iVar22 = ctx_00->style->scrollbar_size;
    iVar21 = ctx_00->style->padding * 2;
    iVar28 = (pmVar26->content_size).x + iVar21;
    iVar21 = iVar21 + (pmVar26->content_size).y;
    rect_00.w = mVar20.x;
    rect_00.h = mVar20.y;
    rect_00.x = (int)extraout_RDX;
    rect_00.y = (int)(extraout_RDX >> 0x20);
    mu_push_clip_rect(ctx_00,rect_00);
    mVar27 = (mu_Vec2)((ulong)mVar20 & 0xffffffff00000000 | (ulong)(uint)(mVar20.x - iVar22));
    if (iVar21 <= (pmVar26->body).h) {
      mVar27 = mVar20;
    }
    uVar23 = mVar27.y - iVar22;
    mVar20 = (mu_Vec2)((ulong)uVar23 << 0x20 | (ulong)mVar27 & 0xffffffff);
    if (iVar28 <= (pmVar26->body).w) {
      uVar23 = mVar27.y;
      mVar20 = mVar27;
    }
    iVar22 = iVar21 - uVar23;
    iVar31 = mVar20.x;
    if ((int)uVar23 < 1 || (iVar22 == 0 || iVar21 < (int)uVar23)) {
      (pmVar26->scroll).y = 0;
    }
    else {
      iVar19 = (ctx_00->id_stack).idx;
      if (iVar19 < 1) {
        mVar30 = 0x811c9dc5;
      }
      else {
        mVar30 = (ctx_00->id_stack).items[iVar19 - 1];
      }
      lVar16 = 0;
      do {
        mVar30 = ((byte)"!scrollbary"[lVar16] ^ mVar30) * 0x1000193;
        lVar16 = lVar16 + 1;
      } while ((int)lVar16 != 0xb);
      ctx_00->last_id = mVar30;
      uVar35 = (ulong)(uint)ctx_00->style->scrollbar_size;
      uVar24 = (ulong)mVar20 & 0xffffffff00000000 | uVar35;
      uVar25 = extraout_RDX & 0xffffffff00000000 | (ulong)(uint)(iVar31 + iVar33);
      rect_07.w = (int)uVar24;
      rect_07.h = (int)(uVar24 >> 0x20);
      rect_07.x = (int)uVar25;
      rect_07.y = (int)(uVar25 >> 0x20);
      mu_update_control(ctx_00,mVar30,rect_07,0);
      iVar19 = mVar20.y;
      if ((ctx_00->focus == mVar30) && (ctx_00->mouse_down == 1)) {
        piVar2 = &(pmVar26->scroll).y;
        *piVar2 = *piVar2 + ((ctx_00->mouse_delta).y * iVar21) / iVar19;
      }
      iVar14 = (pmVar26->scroll).y;
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      if (iVar22 < iVar14) {
        iVar14 = iVar22;
      }
      (pmVar26->scroll).y = iVar14;
      mVar37.w = (int)uVar24;
      mVar37.h = (int)(uVar24 >> 0x20);
      mVar37.x = (int)uVar25;
      mVar37.y = (int)(uVar25 >> 0x20);
      (*ctx_00->draw_frame)(ctx_00,mVar37,0xc);
      uVar23 = ctx_00->style->thumb_size;
      uVar25 = (long)(ulong)(uint)(iVar19 * iVar19) / (long)iVar21;
      uVar24 = uVar25 & 0xffffffff;
      if ((int)uVar25 < (int)uVar23) {
        uVar24 = (ulong)uVar23;
      }
      mVar38.y = iVar34 + ((iVar19 - (int)uVar24) * (pmVar26->scroll).y) / iVar22;
      mVar38.x = iVar31 + iVar33;
      mVar38._8_8_ = (uVar24 << 0x20) + uVar35;
      (*ctx_00->draw_frame)(ctx_00,mVar38,0xd);
      rect_01.w = mVar20.x;
      rect_01.h = mVar20.y;
      rect_01.x = (int)extraout_RDX;
      rect_01.y = (int)(extraout_RDX >> 0x20);
      iVar22 = mu_mouse_over(ctx_00,rect_01);
      if (iVar22 != 0) {
        ctx_00->scroll_target = pmVar26;
      }
    }
    iVar22 = iVar28 - iVar31;
    if (iVar31 < 1 || (iVar22 == 0 || iVar28 < iVar31)) {
      (pmVar26->scroll).x = 0;
    }
    else {
      iVar21 = (ctx_00->id_stack).idx;
      if (iVar21 < 1) {
        mVar30 = 0x811c9dc5;
      }
      else {
        mVar30 = (ctx_00->id_stack).items[iVar21 - 1];
      }
      lVar16 = 0;
      do {
        mVar30 = ((byte)"!scrollbarx"[lVar16] ^ mVar30) * 0x1000193;
        lVar16 = lVar16 + 1;
      } while ((int)lVar16 != 0xb);
      ctx_00->last_id = mVar30;
      uVar35 = (ulong)(uint)ctx_00->style->scrollbar_size << 0x20;
      rect_08._8_8_ = (ulong)mVar27 & 0xffffffff | uVar35;
      uVar25 = ((ulong)mVar20 & 0xffffffff00000000) + extraout_RDX;
      rect_08._0_8_ = uVar25;
      mu_update_control(ctx_00,mVar30,rect_08,0);
      if ((ctx_00->focus == mVar30) && (ctx_00->mouse_down == 1)) {
        (pmVar26->scroll).x = (pmVar26->scroll).x + ((ctx_00->mouse_delta).x * iVar28) / iVar31;
      }
      iVar21 = (pmVar26->scroll).x;
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      if (iVar22 < iVar21) {
        iVar21 = iVar22;
      }
      (pmVar26->scroll).x = iVar21;
      mVar39.w = (int)rect_08._8_8_;
      mVar39.h = (int)(rect_08._8_8_ >> 0x20);
      mVar39._0_8_ = uVar25;
      (*ctx_00->draw_frame)(ctx_00,mVar39,0xc);
      uVar23 = ctx_00->style->thumb_size;
      uVar24 = (long)(ulong)(uint)(iVar31 * iVar31) / (long)iVar28;
      uVar32 = uVar24 & 0xffffffff;
      if ((int)uVar24 < (int)uVar23) {
        uVar32 = (ulong)uVar23;
      }
      uVar35 = uVar35 | uVar32;
      mVar40._0_8_ = uVar25 & 0xffffffff00000000 |
                     (ulong)(uint)(((iVar31 - (int)uVar32) * (pmVar26->scroll).x) / iVar22 + iVar33)
      ;
      mVar40.w = (int)uVar35;
      mVar40.h = (int)(uVar35 >> 0x20);
      (*ctx_00->draw_frame)(ctx_00,mVar40,0xd);
      rect_02.w = mVar20.x;
      rect_02.h = mVar20.y;
      rect_02.x = (int)extraout_RDX;
      rect_02.y = (int)(extraout_RDX >> 0x20);
      iVar22 = mu_mouse_over(ctx_00,rect_02);
      if (iVar22 != 0) {
        ctx_00->scroll_target = pmVar26;
      }
    }
    mu_pop_clip_rect(ctx_00);
  }
  iVar22 = ctx_00->style->padding;
  body.x = iVar22 + iVar33;
  body.w = mVar20.x + iVar22 * -2;
  body.y = iVar34 + iVar22;
  body.h = mVar20.y + iVar22 * -2;
  push_layout(ctx_00,body,pmVar26->scroll);
  (pmVar26->body).x = (int)extraout_RDX;
  (pmVar26->body).y = (int)(extraout_RDX >> 0x20);
  (pmVar26->body).w = mVar20.x;
  (pmVar26->body).h = mVar20.y;
  return extraout_EAX;
}

Assistant:

int mu_begin_window_ex(mu_Context *ctx, const char *title, mu_Rect rect, int opt) {
  mu_Rect body;
  mu_Id id = mu_get_id(ctx, title, strlen(title));
  mu_Container *cnt = get_container(ctx, id, opt);
  if (!cnt || !cnt->open) { return 0; }
  push(ctx->id_stack, id);

  if (cnt->rect.w == 0 || opt & MU_OPT_FORCE_RESIZE) {
    cnt->rect = rect;
  }
  begin_root_container(ctx, cnt);
  rect = body = cnt->rect;

  /* draw frame */
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, rect, MU_COLOR_WINDOWBG);
  }

  /* do title bar */
  if (~opt & MU_OPT_NOTITLE) {
    mu_Rect tr = rect;
    tr.h = ctx->style->title_height;
    ctx->draw_frame(ctx, tr, MU_COLOR_TITLEBG);

    /* do title text */
    if (~opt & MU_OPT_NOTITLE) {
      mu_Id id = mu_get_id(ctx, "!title", 6);
      mu_update_control(ctx, id, tr, opt);
      mu_draw_control_text(ctx, title, tr, MU_COLOR_TITLETEXT, opt);
      if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
        cnt->rect.x += ctx->mouse_delta.x;
        cnt->rect.y += ctx->mouse_delta.y;
      }
      body.y += tr.h;
      body.h -= tr.h;
    }

    /* do `close` button */
    if (~opt & MU_OPT_NOCLOSE) {
      mu_Id id = mu_get_id(ctx, "!close", 6);
      mu_Rect r = mu_rect(tr.x + tr.w - tr.h, tr.y, tr.h, tr.h);
      tr.w -= r.w;
      mu_draw_icon(ctx, MU_ICON_CLOSE, r, ctx->style->colors[MU_COLOR_TITLETEXT]);
      mu_update_control(ctx, id, r, opt);
      if (ctx->mouse_pressed == MU_MOUSE_LEFT && id == ctx->focus) {
        cnt->open = 0;
      }
    }
  }

  push_container_body(ctx, cnt, body, opt);

  /* do `resize` handle */
  if (~opt & MU_OPT_NORESIZE) {
    int sz = ctx->style->title_height;
    mu_Id id = mu_get_id(ctx, "!resize", 7);
    mu_Rect r = mu_rect(rect.x + rect.w - sz, rect.y + rect.h - sz, sz, sz);
    mu_update_control(ctx, id, r, opt);
    if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
      cnt->rect.w = mu_max(96, cnt->rect.w + ctx->mouse_delta.x);
      cnt->rect.h = mu_max(64, cnt->rect.h + ctx->mouse_delta.y);
    }
  }

  /* resize to content size */
  if (opt & MU_OPT_AUTOSIZE) {
    mu_Rect r = get_layout(ctx)->body;
    cnt->rect.w = cnt->content_size.x + (cnt->rect.w - r.w);
    cnt->rect.h = cnt->content_size.y + (cnt->rect.h - r.h);
  }

  /* close if this is a popup window and elsewhere was clicked */
  if (opt & MU_OPT_POPUP && ctx->mouse_pressed && ctx->hover_root != cnt) {
    cnt->open = 0;
  }

  mu_push_clip_rect(ctx, cnt->body);
  return MU_RES_ACTIVE;
}